

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_std_array.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *__range1;
  long *plVar2;
  long lVar3;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  greetings;
  undefined8 uStack_90;
  undefined1 *local_88;
  long lStack_80;
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  
  local_88 = local_78;
  uStack_90 = 0x10131b;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Hello","");
  local_68[0] = local_58;
  uStack_90 = 0x10133f;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Hi","");
  plVar2 = local_38;
  uStack_90 = 0x101364;
  local_48[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Aloha","");
  lVar3 = 8;
  do {
    uStack_90 = 0x10138e;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)((long)&uStack_90 + lVar3),
                        *(long *)((long)&local_88 + lVar3));
    uStack_90 = 0x10139e;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x68);
  uStack_90 = 0x1013c0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  uStack_90 = 0x1013cb;
  std::__insertion_sort<std::__cxx11::string*,__gnu_cxx::__ops::_Iter_less_iter>
            (&local_88,&stack0xffffffffffffffd8);
  lVar3 = 8;
  do {
    uStack_90 = 0x1013f0;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)((long)&uStack_90 + lVar3),
                        *(long *)((long)&local_88 + lVar3));
    uStack_90 = 0x101400;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x68);
  uStack_90 = 0x101422;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  lVar3 = -0x60;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      uStack_90 = 0x10143f;
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return 0;
}

Assistant:

int main() {
  std::array<std::string, 3> greetings =
    { "Hello", "Hi", "Aloha" };
  for (auto const & word : greetings)
    std::cout << word << " ";
  std::cout << "\n";

  std::sort(greetings.begin(), greetings.end());
  for (auto const & word : greetings)
    std::cout << word << " ";
  std::cout << "\n";
}